

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall chrono::utils::MixtureIngredient::~MixtureIngredient(MixtureIngredient *this)

{
  freeMaterialDist(this);
  ::operator_delete(this->m_densityDist,0x20);
  ::operator_delete(this->m_sizeDist,0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->add_body_callback).
              super___shared_ptr<chrono::utils::MixtureIngredient::AddBodyCallback,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_defMaterialSMC).
              super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_defMaterialNSC).
              super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

MixtureIngredient::~MixtureIngredient() {
    freeMaterialDist();
    delete m_densityDist;
    delete m_sizeDist;
}